

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O0

void __thiscall BamTools::FilterTool::FilterTool(FilterTool *this)

{
  _func_int **pp_Var1;
  OptionGroup *pOVar2;
  OptionGroup *valueDescription;
  AbstractTool *in_RDI;
  string isSingletonDesc;
  string isSecondMateDesc;
  string isReverseDesc;
  string isProperPairDesc;
  string isPrimaryDesc;
  string isPairedDesc;
  string isMateReverseDesc;
  string isMateMappedDesc;
  string isMappedDesc;
  string isFirstMateDesc;
  string isFailQcDesc;
  string isDupDesc;
  string boolArg;
  OptionGroup *AlignmentFlagOpts;
  string tagDesc;
  string queryDesc;
  string nameDesc;
  string mapQualDesc;
  string lengthDesc;
  string insertDesc;
  string flagDesc;
  OptionGroup *FilterOpts;
  string forceDesc;
  string scriptDesc;
  string regionDesc;
  string outDesc;
  string listDesc;
  string inDesc;
  OptionGroup *IO_Opts;
  string usage;
  string *in_stack_ffffffffffffedd8;
  string *in_stack_ffffffffffffede0;
  string *in_stack_ffffffffffffee30;
  allocator *paVar3;
  OptionGroup *in_stack_ffffffffffffeea8;
  FilterSettings *in_stack_ffffffffffffeeb0;
  string *in_stack_ffffffffffffeeb8;
  string *in_stack_ffffffffffffeec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeec8;
  bool *in_stack_ffffffffffffeed0;
  string *in_stack_ffffffffffffeed8;
  string *in_stack_ffffffffffffeee0;
  string *in_stack_ffffffffffffeee8;
  string *in_stack_ffffffffffffeef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  OptionGroup *in_stack_ffffffffffffef00;
  allocator *paVar4;
  string *in_stack_ffffffffffffef08;
  string *valueTypeDescription;
  string *in_stack_ffffffffffffef10;
  string *optionDescription;
  string *in_stack_ffffffffffffef18;
  OptionGroup *in_stack_ffffffffffffef20;
  string *argument;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef28;
  OptionGroup *in_stack_ffffffffffffef30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultValue;
  allocator local_eb1;
  string local_eb0 [39];
  allocator local_e89;
  string local_e88 [39];
  allocator local_e61;
  string local_e60 [39];
  allocator local_e39;
  string local_e38 [39];
  allocator local_e11;
  string local_e10 [39];
  allocator local_de9;
  string local_de8 [39];
  allocator local_dc1;
  string local_dc0 [39];
  allocator local_d99;
  string local_d98 [39];
  allocator local_d71;
  string local_d70 [39];
  allocator local_d49;
  string local_d48 [39];
  allocator local_d21;
  string local_d20 [39];
  allocator local_cf9;
  string local_cf8 [39];
  allocator local_cd1;
  string local_cd0 [39];
  allocator local_ca9;
  string local_ca8 [39];
  allocator local_c81;
  string local_c80 [39];
  allocator local_c59;
  string local_c58 [39];
  allocator local_c31;
  string local_c30 [39];
  allocator local_c09;
  string local_c08 [39];
  allocator local_be1;
  string local_be0 [39];
  allocator local_bb9;
  string local_bb8 [39];
  allocator local_b91;
  string local_b90 [39];
  allocator local_b69;
  string local_b68 [39];
  allocator local_b41;
  string local_b40 [39];
  allocator local_b19;
  string local_b18 [39];
  allocator local_af1;
  string local_af0 [39];
  allocator local_ac9;
  string local_ac8 [39];
  allocator local_aa1;
  string local_aa0 [39];
  allocator local_a79;
  string local_a78 [39];
  allocator local_a51;
  string local_a50 [39];
  allocator local_a29;
  string local_a28 [39];
  allocator local_a01;
  string local_a00 [39];
  allocator local_9d9;
  string local_9d8 [39];
  allocator local_9b1;
  string local_9b0 [39];
  undefined1 local_989 [40];
  allocator local_961;
  string local_960 [39];
  undefined1 local_939 [40];
  undefined1 local_911 [40];
  undefined1 local_8e9 [33];
  OptionGroup *local_8c8;
  allocator local_8b9;
  string local_8b8 [39];
  undefined1 local_891 [40];
  undefined1 local_869 [40];
  allocator local_841;
  string local_840 [39];
  allocator local_819;
  string local_818 [39];
  allocator local_7f1;
  string local_7f0 [39];
  allocator local_7c9;
  string local_7c8 [39];
  allocator local_7a1;
  string local_7a0 [39];
  allocator local_779;
  string local_778 [39];
  allocator local_751;
  string local_750 [39];
  allocator local_729;
  string local_728 [39];
  allocator local_701;
  string local_700 [39];
  allocator local_6d9;
  string local_6d8 [39];
  allocator local_6b1;
  string local_6b0 [39];
  allocator local_689;
  string local_688 [39];
  allocator local_661;
  string local_660 [39];
  allocator local_639;
  string local_638 [39];
  allocator local_611;
  string local_610 [39];
  allocator local_5e9;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [39];
  allocator local_599;
  string local_598 [39];
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [39];
  allocator local_481;
  string local_480 [39];
  allocator local_459;
  string local_458 [32];
  OptionGroup *local_438;
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [32];
  OptionGroup *local_98;
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [39];
  allocator local_39;
  string local_38 [56];
  
  AbstractTool::AbstractTool(in_RDI);
  in_RDI->_vptr_AbstractTool = (_func_int **)&PTR__FilterTool_0033ee28;
  pp_Var1 = (_func_int **)operator_new(0x318);
  FilterSettings::FilterSettings(in_stack_ffffffffffffeeb0);
  in_RDI[1]._vptr_AbstractTool = pp_Var1;
  in_RDI[2]._vptr_AbstractTool = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,
             "[-in <filename> -in <filename> ... | -list <filelist>] [-out <filename> | [-forceCompression]] [-region <REGION>] [ [-script <filename] | [filterOptions] ]"
             ,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"bamtools filter",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"filters BAM file(s)",&local_89);
  Options::SetProgramInfo(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,(string *)0x20208b);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Input & Output",&local_b9);
  pOVar2 = Options::CreateOptionGroup(in_stack_ffffffffffffee30);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_98 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"the input BAM file(s)",&local_e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"the input BAM file list, one line per file",&local_109);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"the output BAM file",&local_131);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_158,
             "only read data from this genomic region (see documentation for more details)",
             &local_159);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_180,"the filter script file (see documentation for more details)",&local_181);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1a8,
             "if results are sent to stdout (like when piping to another tool), default behavior is to leave output uncompressed. Use this flag to override and force compression"
             ,&local_1a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"-in",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"BAM filename",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"",&local_221);
  Options::StandardIn_abi_cxx11_();
  Options::
  AddValueOption<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const>
            (in_stack_ffffffffffffef10,in_stack_ffffffffffffef08,&in_stack_ffffffffffffef00->Name,
             in_stack_ffffffffffffeef8,(bool *)in_stack_ffffffffffffeef0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffeee8,in_stack_ffffffffffffef20,in_stack_ffffffffffffef28);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"-list",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"filename",&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"",&local_299);
  Options::AddValueOption<std::__cxx11::string>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             in_stack_ffffffffffffef00);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"-out",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"BAM filename",&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"",&local_311);
  Options::StandardOut_abi_cxx11_();
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&in_stack_ffffffffffffef20->Name,in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
             in_stack_ffffffffffffef08,(bool *)in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8,
             in_stack_ffffffffffffef30,in_stack_ffffffffffffef38);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"-region",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"REGION",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"",&local_389);
  Options::AddValueOption<std::__cxx11::string>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             in_stack_ffffffffffffef00);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"-script",&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"filename",&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"",&local_401);
  Options::AddValueOption<std::__cxx11::string>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             in_stack_ffffffffffffef00);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"-forceCompression",&local_429);
  Options::AddOption(in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8,
                     &in_stack_ffffffffffffeeb0->HasInput,in_stack_ffffffffffffeea8);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"General Filters",&local_459);
  pOVar2 = Options::CreateOptionGroup(in_stack_ffffffffffffee30);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  local_438 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_480,
             "keep reads with this *exact* alignment flag (for more detailed queries, see below)",
             &local_481);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4a8,"keep reads with insert size that matches pattern",&local_4a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d0,"keep reads with length that matches pattern",&local_4d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4f8,"keep reads with map quality that matches pattern",&local_4f9);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"keep reads with name that matches pattern",&local_521);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"keep reads with motif that matches pattern",&local_549);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"keep reads with this key=>value pair",&local_571);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_598,"-alignmentFlag",&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c0,"int",&local_5c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e8,"",&local_5e9);
  Options::AddValueOption<std::__cxx11::string>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             in_stack_ffffffffffffef00);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_610,"-insertSize",&local_611);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_638,"int",&local_639);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_660,"",&local_661);
  Options::AddValueOption<std::__cxx11::string>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             in_stack_ffffffffffffef00);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator((allocator<char> *)&local_661);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator((allocator<char> *)&local_639);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_688,"-length",&local_689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6b0,"int",&local_6b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d8,"",&local_6d9);
  Options::AddValueOption<std::__cxx11::string>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             in_stack_ffffffffffffef00);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  std::__cxx11::string::~string(local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  std::__cxx11::string::~string(local_688);
  std::allocator<char>::~allocator((allocator<char> *)&local_689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_700,"-mapQuality",&local_701);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_728,"[0-255]",&local_729);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_750,"",&local_751);
  Options::AddValueOption<std::__cxx11::string>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             in_stack_ffffffffffffef00);
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::~allocator((allocator<char> *)&local_751);
  std::__cxx11::string::~string(local_728);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  std::__cxx11::string::~string(local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_778,"-name",&local_779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7a0,"string",&local_7a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c8,"",&local_7c9);
  Options::AddValueOption<std::__cxx11::string>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             in_stack_ffffffffffffef00);
  std::__cxx11::string::~string(local_7c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
  std::__cxx11::string::~string(local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  std::__cxx11::string::~string(local_778);
  std::allocator<char>::~allocator((allocator<char> *)&local_779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f0,"-queryBases",&local_7f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_818,"string",&local_819);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_840,"",&local_841);
  Options::AddValueOption<std::__cxx11::string>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             in_stack_ffffffffffffef00);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator((allocator<char> *)&local_819);
  std::__cxx11::string::~string(local_7f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
  defaultValue = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_869;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_869 + 1),"-tag",(allocator *)defaultValue);
  pOVar2 = (OptionGroup *)local_891;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_891 + 1),"TAG:VALUE",(allocator *)pOVar2);
  paVar4 = &local_8b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8b8,"",paVar4);
  Options::AddValueOption<std::__cxx11::string>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             in_stack_ffffffffffffef00);
  std::__cxx11::string::~string(local_8b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8b9);
  std::__cxx11::string::~string((string *)(local_891 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_891);
  std::__cxx11::string::~string((string *)(local_869 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_869);
  argument = (string *)local_8e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_8e9 + 1),"Alignment Flag Filters",(allocator *)argument);
  valueDescription = Options::CreateOptionGroup(in_stack_ffffffffffffee30);
  std::__cxx11::string::~string((string *)(local_8e9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_8e9);
  optionDescription = (string *)local_911;
  local_8c8 = valueDescription;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_911 + 1),"true/false",(allocator *)optionDescription);
  std::allocator<char>::~allocator((allocator<char> *)local_911);
  valueTypeDescription = (string *)local_939;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_939 + 1),"keep only alignments that are marked as duplicate?",
             (allocator *)valueTypeDescription);
  std::allocator<char>::~allocator((allocator<char> *)local_939);
  paVar4 = &local_961;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_960,"keep only alignments that failed QC?",paVar4);
  std::allocator<char>::~allocator((allocator<char> *)&local_961);
  val = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_989;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_989 + 1),"keep only alignments marked as first mate?",(allocator *)val
            );
  std::allocator<char>::~allocator((allocator<char> *)local_989);
  paVar3 = &local_9b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9b0,"keep only alignments that were mapped?",paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
  paVar3 = &local_9d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9d8,"keep only alignments with mates that mapped",paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
  paVar3 = &local_a01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a00,"keep only alignments with mate on reverese strand?",paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_a01);
  paVar3 = &local_a29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a28,"keep only alignments that were sequenced as paired?",paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_a29);
  paVar3 = &local_a51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a50,"keep only alignments marked as primary?",paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_a51);
  paVar3 = &local_a79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a78,"keep only alignments that passed PE resolution?",paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_a79);
  paVar3 = &local_aa1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_aa0,"keep only alignments on reverse strand?",paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
  paVar3 = &local_ac9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac8,"keep only alignments marked as second mate?",paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
  paVar3 = &local_af1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_af0,"keep only singletons",paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_af1);
  paVar3 = &local_b19;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b18,"-isDuplicate",paVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b40,"",&local_b41);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (argument,&valueDescription->Name,optionDescription,valueTypeDescription,(bool *)paVar4,
             val,pOVar2,defaultValue);
  std::__cxx11::string::~string(local_b40);
  std::allocator<char>::~allocator((allocator<char> *)&local_b41);
  std::__cxx11::string::~string(local_b18);
  std::allocator<char>::~allocator((allocator<char> *)&local_b19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b68,"-isFailedQC",&local_b69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b90,"",&local_b91);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (argument,&valueDescription->Name,optionDescription,valueTypeDescription,(bool *)paVar4,
             val,pOVar2,defaultValue);
  std::__cxx11::string::~string(local_b90);
  std::allocator<char>::~allocator((allocator<char> *)&local_b91);
  std::__cxx11::string::~string(local_b68);
  std::allocator<char>::~allocator((allocator<char> *)&local_b69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bb8,"-isFirstMate",&local_bb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_be0,"",&local_be1);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (argument,&valueDescription->Name,optionDescription,valueTypeDescription,(bool *)paVar4,
             val,pOVar2,defaultValue);
  std::__cxx11::string::~string(local_be0);
  std::allocator<char>::~allocator((allocator<char> *)&local_be1);
  std::__cxx11::string::~string(local_bb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c08,"-isMapped",&local_c09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c30,"",&local_c31);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (argument,&valueDescription->Name,optionDescription,valueTypeDescription,(bool *)paVar4,
             val,pOVar2,defaultValue);
  std::__cxx11::string::~string(local_c30);
  std::allocator<char>::~allocator((allocator<char> *)&local_c31);
  std::__cxx11::string::~string(local_c08);
  std::allocator<char>::~allocator((allocator<char> *)&local_c09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c58,"-isMateMapped",&local_c59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c80,"",&local_c81);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (argument,&valueDescription->Name,optionDescription,valueTypeDescription,(bool *)paVar4,
             val,pOVar2,defaultValue);
  std::__cxx11::string::~string(local_c80);
  std::allocator<char>::~allocator((allocator<char> *)&local_c81);
  std::__cxx11::string::~string(local_c58);
  std::allocator<char>::~allocator((allocator<char> *)&local_c59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ca8,"-isMateReverseStrand",&local_ca9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cd0,"",&local_cd1);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (argument,&valueDescription->Name,optionDescription,valueTypeDescription,(bool *)paVar4,
             val,pOVar2,defaultValue);
  std::__cxx11::string::~string(local_cd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
  std::__cxx11::string::~string(local_ca8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ca9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cf8,"-isPaired",&local_cf9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d20,"",&local_d21);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (argument,&valueDescription->Name,optionDescription,valueTypeDescription,(bool *)paVar4,
             val,pOVar2,defaultValue);
  std::__cxx11::string::~string(local_d20);
  std::allocator<char>::~allocator((allocator<char> *)&local_d21);
  std::__cxx11::string::~string(local_cf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cf9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d48,"-isPrimaryAlignment",&local_d49);
  paVar3 = &local_d71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d70,"",paVar3);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (argument,&valueDescription->Name,optionDescription,valueTypeDescription,(bool *)paVar4,
             val,pOVar2,defaultValue);
  std::__cxx11::string::~string(local_d70);
  std::allocator<char>::~allocator((allocator<char> *)&local_d71);
  std::__cxx11::string::~string(local_d48);
  std::allocator<char>::~allocator((allocator<char> *)&local_d49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d98,"-isProperPair",&local_d99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dc0,"",&local_dc1);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (argument,&valueDescription->Name,optionDescription,valueTypeDescription,(bool *)paVar4,
             val,pOVar2,defaultValue);
  std::__cxx11::string::~string(local_dc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_dc1);
  std::__cxx11::string::~string(local_d98);
  std::allocator<char>::~allocator((allocator<char> *)&local_d99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_de8,"-isReverseStrand",&local_de9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e10,"",&local_e11);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (argument,&valueDescription->Name,optionDescription,valueTypeDescription,(bool *)paVar4,
             val,pOVar2,defaultValue);
  std::__cxx11::string::~string(local_e10);
  std::allocator<char>::~allocator((allocator<char> *)&local_e11);
  std::__cxx11::string::~string(local_de8);
  std::allocator<char>::~allocator((allocator<char> *)&local_de9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e38,"-isSecondMate",&local_e39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e60,"",&local_e61);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (argument,&valueDescription->Name,optionDescription,valueTypeDescription,(bool *)paVar4,
             val,pOVar2,defaultValue);
  std::__cxx11::string::~string(local_e60);
  std::allocator<char>::~allocator((allocator<char> *)&local_e61);
  std::__cxx11::string::~string(local_e38);
  std::allocator<char>::~allocator((allocator<char> *)&local_e39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e88,"-isSingleton",&local_e89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_eb0,"",&local_eb1);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (argument,&valueDescription->Name,optionDescription,valueTypeDescription,(bool *)paVar4,
             val,pOVar2,defaultValue);
  std::__cxx11::string::~string(local_eb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
  std::__cxx11::string::~string(local_e88);
  std::allocator<char>::~allocator((allocator<char> *)&local_e89);
  std::__cxx11::string::~string(local_af0);
  std::__cxx11::string::~string(local_ac8);
  std::__cxx11::string::~string(local_aa0);
  std::__cxx11::string::~string(local_a78);
  std::__cxx11::string::~string(local_a50);
  std::__cxx11::string::~string(local_a28);
  std::__cxx11::string::~string(local_a00);
  std::__cxx11::string::~string(local_9d8);
  std::__cxx11::string::~string(local_9b0);
  std::__cxx11::string::~string((string *)(local_989 + 1));
  std::__cxx11::string::~string(local_960);
  std::__cxx11::string::~string((string *)(local_939 + 1));
  std::__cxx11::string::~string((string *)(local_911 + 1));
  std::__cxx11::string::~string(local_570);
  std::__cxx11::string::~string(local_548);
  std::__cxx11::string::~string(local_520);
  std::__cxx11::string::~string(local_4f8);
  std::__cxx11::string::~string(local_4d0);
  std::__cxx11::string::~string(local_4a8);
  std::__cxx11::string::~string(local_480);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

FilterTool::FilterTool()
    : AbstractTool()
    , m_settings(new FilterSettings)
    , m_impl(0)
{
    // ----------------------------------
    // set program details

    const std::string usage =
        "[-in <filename> -in <filename> ... | -list <filelist>] "
        "[-out <filename> | [-forceCompression]] [-region <REGION>] "
        "[ [-script <filename] | [filterOptions] ]";

    Options::SetProgramInfo("bamtools filter", "filters BAM file(s)", usage);

    // ----------------------------------
    // I/O options

    OptionGroup* IO_Opts = Options::CreateOptionGroup("Input & Output");

    const std::string inDesc = "the input BAM file(s)";
    const std::string listDesc = "the input BAM file list, one line per file";
    const std::string outDesc = "the output BAM file";
    const std::string regionDesc =
        "only read data from this genomic region (see documentation for more details)";
    const std::string scriptDesc = "the filter script file (see documentation for more details)";
    const std::string forceDesc =
        "if results are sent to stdout (like when piping to another tool), "
        "default behavior is to leave output uncompressed. Use this flag to "
        "override and force compression";

    Options::AddValueOption("-in", "BAM filename", inDesc, "", m_settings->HasInput,
                            m_settings->InputFiles, IO_Opts, Options::StandardIn());
    Options::AddValueOption("-list", "filename", listDesc, "", m_settings->HasInputFilelist,
                            m_settings->InputFilelist, IO_Opts);
    Options::AddValueOption("-out", "BAM filename", outDesc, "", m_settings->HasOutput,
                            m_settings->OutputFilename, IO_Opts, Options::StandardOut());
    Options::AddValueOption("-region", "REGION", regionDesc, "", m_settings->HasRegion,
                            m_settings->Region, IO_Opts);
    Options::AddValueOption("-script", "filename", scriptDesc, "", m_settings->HasScript,
                            m_settings->ScriptFilename, IO_Opts);
    Options::AddOption("-forceCompression", forceDesc, m_settings->IsForceCompression, IO_Opts);

    // ----------------------------------
    // general filter options

    OptionGroup* FilterOpts = Options::CreateOptionGroup("General Filters");

    const std::string flagDesc =
        "keep reads with this *exact* alignment flag (for more detailed queries, see below)";
    const std::string insertDesc = "keep reads with insert size that matches pattern";
    const std::string lengthDesc = "keep reads with length that matches pattern";
    const std::string mapQualDesc = "keep reads with map quality that matches pattern";
    const std::string nameDesc = "keep reads with name that matches pattern";
    const std::string queryDesc = "keep reads with motif that matches pattern";
    const std::string tagDesc = "keep reads with this key=>value pair";

    Options::AddValueOption("-alignmentFlag", "int", flagDesc, "",
                            m_settings->HasAlignmentFlagFilter, m_settings->AlignmentFlagFilter,
                            FilterOpts);
    Options::AddValueOption("-insertSize", "int", insertDesc, "", m_settings->HasInsertSizeFilter,
                            m_settings->InsertSizeFilter, FilterOpts);
    Options::AddValueOption("-length", "int", lengthDesc, "", m_settings->HasLengthFilter,
                            m_settings->LengthFilter, FilterOpts);
    Options::AddValueOption("-mapQuality", "[0-255]", mapQualDesc, "",
                            m_settings->HasMapQualityFilter, m_settings->MapQualityFilter,
                            FilterOpts);
    Options::AddValueOption("-name", "string", nameDesc, "", m_settings->HasNameFilter,
                            m_settings->NameFilter, FilterOpts);
    Options::AddValueOption("-queryBases", "string", queryDesc, "", m_settings->HasQueryBasesFilter,
                            m_settings->QueryBasesFilter, FilterOpts);
    Options::AddValueOption("-tag", "TAG:VALUE", tagDesc, "", m_settings->HasTagFilter,
                            m_settings->TagFilter, FilterOpts);

    // ----------------------------------
    // alignment flag filter options

    OptionGroup* AlignmentFlagOpts = Options::CreateOptionGroup("Alignment Flag Filters");

    const std::string boolArg = "true/false";
    const std::string isDupDesc = "keep only alignments that are marked as duplicate?";
    const std::string isFailQcDesc = "keep only alignments that failed QC?";
    const std::string isFirstMateDesc = "keep only alignments marked as first mate?";
    const std::string isMappedDesc = "keep only alignments that were mapped?";
    const std::string isMateMappedDesc = "keep only alignments with mates that mapped";
    const std::string isMateReverseDesc = "keep only alignments with mate on reverese strand?";
    const std::string isPairedDesc = "keep only alignments that were sequenced as paired?";
    const std::string isPrimaryDesc = "keep only alignments marked as primary?";
    const std::string isProperPairDesc = "keep only alignments that passed PE resolution?";
    const std::string isReverseDesc = "keep only alignments on reverse strand?";
    const std::string isSecondMateDesc = "keep only alignments marked as second mate?";
    const std::string isSingletonDesc = "keep only singletons";

    Options::AddValueOption("-isDuplicate", boolArg, isDupDesc, "",
                            m_settings->HasIsDuplicateFilter, m_settings->IsDuplicateFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isFailedQC", boolArg, isFailQcDesc, "",
                            m_settings->HasIsFailedQCFilter, m_settings->IsFailedQCFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isFirstMate", boolArg, isFirstMateDesc, "",
                            m_settings->HasIsFirstMateFilter, m_settings->IsFirstMateFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isMapped", boolArg, isMappedDesc, "", m_settings->HasIsMappedFilter,
                            m_settings->IsMappedFilter, AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isMateMapped", boolArg, isMateMappedDesc, "",
                            m_settings->HasIsMateMappedFilter, m_settings->IsMateMappedFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isMateReverseStrand", boolArg, isMateReverseDesc, "",
                            m_settings->HasIsMateReverseStrandFilter,
                            m_settings->IsMateReverseStrandFilter, AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isPaired", boolArg, isPairedDesc, "", m_settings->HasIsPairedFilter,
                            m_settings->IsPairedFilter, AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isPrimaryAlignment", boolArg, isPrimaryDesc, "",
                            m_settings->HasIsPrimaryAlignmentFilter,
                            m_settings->IsPrimaryAlignmentFilter, AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isProperPair", boolArg, isProperPairDesc, "",
                            m_settings->HasIsProperPairFilter, m_settings->IsProperPairFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isReverseStrand", boolArg, isReverseDesc, "",
                            m_settings->HasIsReverseStrandFilter, m_settings->IsReverseStrandFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isSecondMate", boolArg, isSecondMateDesc, "",
                            m_settings->HasIsSecondMateFilter, m_settings->IsSecondMateFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isSingleton", boolArg, isSingletonDesc, "",
                            m_settings->HasIsSingletonFilter, m_settings->IsSingletonFilter,
                            AlignmentFlagOpts, TRUE_STR);
}